

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_upgrade2
              (nghttp2_session *session,uint8_t *settings_payload,size_t settings_payloadlen,
              int head_request,void *stream_user_data)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = nghttp2_session_upgrade_internal
                    (session,settings_payload,settings_payloadlen,stream_user_data);
  if (iVar1 == 0) {
    pvVar2 = nghttp2_map_find(&session->streams,1);
    if ((pvVar2 == (void *)0x0) || ((*(byte *)((long)pvVar2 + 0xd8) & 2) != 0)) {
      pvVar2 = (void *)0x0;
    }
    else if (*(int *)((long)pvVar2 + 0xcc) == 5) {
      pvVar2 = (void *)0x0;
    }
    if (pvVar2 == (void *)0x0) {
      __assert_fail("stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x1fd5,
                    "int nghttp2_session_upgrade2(nghttp2_session *, const uint8_t *, size_t, int, void *)"
                   );
    }
    iVar1 = 0;
    if (head_request != 0) {
      *(byte *)((long)pvVar2 + 0xd5) = *(byte *)((long)pvVar2 + 0xd5) | 1;
    }
  }
  return iVar1;
}

Assistant:

int nghttp2_session_upgrade2(nghttp2_session *session,
                             const uint8_t *settings_payload,
                             size_t settings_payloadlen, int head_request,
                             void *stream_user_data) {
  int rv;
  nghttp2_stream *stream;

  rv = nghttp2_session_upgrade_internal(session, settings_payload,
                                        settings_payloadlen, stream_user_data);
  if (rv != 0) {
    return rv;
  }

  stream = nghttp2_session_get_stream(session, 1);
  assert(stream);

  if (head_request) {
    stream->http_flags |= NGHTTP2_HTTP_FLAG_METH_HEAD;
  }

  return 0;
}